

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_output.cpp
# Opt level: O2

void __thiscall Clasp::Cli::JsonOutput::visitLogicProgramStats(JsonOutput *this,LpStats *lp)

{
  uint32 uVar1;
  char *pcVar2;
  uint32 i;
  int k;
  long lVar3;
  
  lVar3 = 0;
  pushObject(this,"LP",type_object,false);
  pushObject(this,"Rules",type_object,false);
  uVar1 = Asp::RuleStats::sum(lp->rules);
  printKeyValue(this,"Original",(ulong)uVar1);
  uVar1 = Asp::RuleStats::sum(lp->rules + 1);
  printKeyValue(this,"Final",(ulong)uVar1);
  do {
    k = (int)lVar3;
    if (k != 0) {
      if (k == 5) break;
      if (lp->rules[0].key[lVar3] != 0) {
        pcVar2 = Asp::RuleStats::toStr(k);
        pushObject(this,pcVar2,type_object,false);
        printKeyValue(this,"Original",(ulong)lp->rules[0].key[lVar3]);
        printKeyValue(this,"Final",(ulong)lp->rules[1].key[lVar3]);
        popObject(this);
      }
    }
    lVar3 = lVar3 + 1;
  } while( true );
  popObject(this);
  printKeyValue(this,"Atoms",(ulong)lp->atoms);
  if ((ulong)lp->auxAtoms != 0) {
    printKeyValue(this,"AuxAtoms",(ulong)lp->auxAtoms);
  }
  if (lp->disjunctions[0] != 0) {
    pushObject(this,"Disjunctions",type_object,false);
    printKeyValue(this,"Original",(ulong)lp->disjunctions[0]);
    printKeyValue(this,"Final",(ulong)lp->disjunctions[1]);
    popObject(this);
  }
  pushObject(this,"Bodies",type_object,false);
  uVar1 = Asp::BodyStats::sum(lp->bodies);
  printKeyValue(this,"Original",(ulong)uVar1);
  uVar1 = Asp::BodyStats::sum(lp->bodies + 1);
  printKeyValue(this,"Final",(ulong)uVar1);
  for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
    if (lp->disjunctions[lVar3 + -7] != 0) {
      pcVar2 = Asp::BodyStats::toStr((int)lVar3 + 1);
      pushObject(this,pcVar2,type_object,false);
      printKeyValue(this,"Original",(ulong)lp->disjunctions[lVar3 + -7]);
      printKeyValue(this,"Final",(ulong)lp->disjunctions[lVar3 + -4]);
      popObject(this);
    }
  }
  popObject(this);
  if (lp->sccs == 0) {
    pcVar2 = "yes";
  }
  else {
    if (lp->sccs != 0x7ffffff) {
      printKeyValue(this,"Tight","no");
      printKeyValue(this,"SCCs",(ulong)lp->sccs);
      printKeyValue(this,"NonHcfs",(ulong)lp->nonHcfs);
      printKeyValue(this,"UfsNodes",(ulong)lp->ufsNodes);
      printKeyValue(this,"NonHcfGammas",(ulong)lp->gammas);
      goto LAB_0012a864;
    }
    pcVar2 = "N/A";
  }
  printKeyValue(this,"Tight",pcVar2);
LAB_0012a864:
  pushObject(this,"Equivalences",type_object,false);
  printKeyValue(this,"Sum",(ulong)(lp->eqs_[1] + lp->eqs_[0] + lp->eqs_[2]));
  printKeyValue(this,"Atom",(ulong)lp->eqs_[0]);
  printKeyValue(this,"Body",(ulong)lp->eqs_[1]);
  printKeyValue(this,"Other",(ulong)lp->eqs_[2]);
  popObject(this);
  popObject(this);
  return;
}

Assistant:

void JsonOutput::visitLogicProgramStats(const Asp::LpStats& lp) {
	using namespace Asp;
	pushObject("LP");
	pushObject("Rules");
	printKeyValue("Original", lp.rules[0].sum());
	printKeyValue("Final",    lp.rules[1].sum());
	for (uint32 i = 0; i != RuleStats::numKeys(); ++i) {
		if (i != RuleStats::Normal && lp.rules[0][i]) {
			pushObject(RuleStats::toStr(i));
			printKeyValue("Original", lp.rules[0][i]);
			printKeyValue("Final",    lp.rules[1][i]);
			popObject();
		}
	}
	popObject(); // Rules
	printKeyValue("Atoms", lp.atoms);
	if (lp.auxAtoms) { printKeyValue("AuxAtoms", lp.auxAtoms); }
	if (lp.disjunctions[0]) {
		pushObject("Disjunctions");
		printKeyValue("Original", lp.disjunctions[0]);
		printKeyValue("Final", lp.disjunctions[1]);
		popObject();
	}
	pushObject("Bodies");
	printKeyValue("Original", lp.bodies[0].sum());
	printKeyValue("Final"   , lp.bodies[1].sum());
	for (uint32 i = 1; i != BodyStats::numKeys(); ++i) {
		if (lp.bodies[0][i]) {
			pushObject(BodyStats::toStr(i));
			printKeyValue("Original", lp.bodies[0][i]);
			printKeyValue("Final",    lp.bodies[1][i]);
			popObject();
		}
	}
	popObject();
	if      (lp.sccs == 0)              { printKeyValue("Tight", "yes"); }
	else if (lp.sccs == PrgNode::noScc) { printKeyValue("Tight", "N/A"); }
	else                                {
		printKeyValue("Tight", "no");
		printKeyValue("SCCs", lp.sccs);
		printKeyValue("NonHcfs", lp.nonHcfs);
		printKeyValue("UfsNodes", lp.ufsNodes);
		printKeyValue("NonHcfGammas", lp.gammas);
	}
	pushObject("Equivalences");
	printKeyValue("Sum", lp.eqs());
	printKeyValue("Atom", lp.eqs(Var_t::Atom));
	printKeyValue("Body", lp.eqs(Var_t::Body));
	printKeyValue("Other", lp.eqs(Var_t::Hybrid));
	popObject();
	popObject(); // LP
}